

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,void>
               (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *container,ostream *os)

{
  pointer pIVar1;
  pointer pIVar2;
  bool bVar3;
  ostream *in_RCX;
  pointer pIVar4;
  long lVar5;
  Input data;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  pIVar1 = (container->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (container->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 != pIVar2) {
    lVar5 = 0;
    do {
      pIVar4 = pIVar1 + 1;
      if (lVar5 == 0) {
LAB_002137a3:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        data.data_.size_ = (size_t)os;
        data.data_.data_ = (uchar *)(pIVar1->data_).size_;
        bssl::der::PrintTo((der *)(pIVar1->data_).data_,data,in_RCX);
        lVar5 = lVar5 + 1;
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar5 != 0x20) goto LAB_002137a3;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar5 = 0x20;
        bVar3 = true;
      }
    } while ((!bVar3) && (pIVar1 = pIVar4, pIVar4 != pIVar2));
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }